

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ExpressionSyntax * __thiscall
slang::parsing::Parser::parsePrimaryExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  uint uVar1;
  bool bVar2;
  SyntaxKind kind;
  ExpressionSyntax *pEVar3;
  ParenthesizedExpressionSyntax *inner;
  SignedCastExpressionSyntax *pSVar4;
  MultipleConcatenationExpressionSyntax *name;
  StreamingConcatenationExpressionSyntax *pSVar5;
  SystemNameSyntax *pSVar6;
  LiteralExpressionSyntax *pLVar7;
  SourceLocation location;
  Diagnostic *this_00;
  AssignmentPatternExpressionSyntax *pAVar8;
  EmptyQueueExpressionSyntax *pEVar9;
  ConcatenationExpressionSyntax *pCVar10;
  Token TVar11;
  Token TVar12;
  Token TVar13;
  Token openParen_00;
  Token closeParen_00;
  SourceRange range;
  Token closeParen;
  Token openParen;
  
  TVar11 = ParserBase::peek(&this->super_ParserBase);
  uVar1 = TVar11._0_4_ & 0xffff;
  switch(uVar1) {
  case 3:
    TVar11 = ParserBase::consume(&this->super_ParserBase);
    pSVar6 = slang::syntax::SyntaxFactory::systemName(&this->factory,TVar11);
    return (ExpressionSyntax *)pSVar6;
  case 5:
  case 6:
    pEVar3 = parseIntegerExpression(this,SUB41((options.m_bits & 0x20) >> 5,0));
    return pEVar3;
  case 8:
    TVar12 = NumberParser::parseReal<slang::parsing::Parser>(&this->numberParser,this);
    kind = RealLiteralExpression;
    goto LAB_001bfe6e;
  case 9:
    TVar12 = NumberParser::parseReal<slang::parsing::Parser>(&this->numberParser,this);
    kind = TimeLiteralExpression;
    goto LAB_001bfe6e;
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
switchD_001bfc50_caseD_a:
    bVar2 = slang::syntax::SyntaxFacts::isPossibleDataType(TVar11.kind);
    if (((bVar2) && (TVar11.kind != Identifier)) && ((TVar11._0_4_ & 0xffff) != 0x155)) {
      name = (MultipleConcatenationExpressionSyntax *)
             parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x0);
      bVar2 = ParserBase::peek(&this->super_ParserBase,ApostropheOpenBrace);
      if (bVar2) {
LAB_001bff2c:
        pAVar8 = parseAssignmentPatternExpression(this,(DataTypeSyntax *)name);
        return (ExpressionSyntax *)pAVar8;
      }
    }
    else {
      name = (MultipleConcatenationExpressionSyntax *)
             parseName(this,(bitmask<slang::parsing::detail::NameOptions>)
                            ((options.m_bits & 0x10) * 2 + 0x10));
      bVar2 = ParserBase::peek(&this->super_ParserBase,ApostropheOpenBrace);
      if (bVar2) {
        name = (MultipleConcatenationExpressionSyntax *)
               slang::syntax::SyntaxFactory::namedType(&this->factory,(NameSyntax *)name);
        goto LAB_001bff2c;
      }
    }
    break;
  case 0xc:
    name = (MultipleConcatenationExpressionSyntax *)0x0;
    goto LAB_001bff2c;
  case 0xd:
    TVar11 = ParserBase::consume(&this->super_ParserBase);
    TVar13 = ParserBase::peek(&this->super_ParserBase);
    if (TVar13.kind - 0x45 < 2) {
      pSVar5 = parseStreamConcatenation(this,TVar11);
      return (ExpressionSyntax *)pSVar5;
    }
    if (TVar13.kind == CloseBrace) {
      TVar13 = ParserBase::consume(&this->super_ParserBase);
      pEVar9 = slang::syntax::SyntaxFactory::emptyQueueExpression(&this->factory,TVar11,TVar13);
      return (ExpressionSyntax *)pEVar9;
    }
    pEVar3 = parseExpression(this);
    bVar2 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
    if (!bVar2) {
      pCVar10 = parseConcatenation(this,TVar11,pEVar3);
      return (ExpressionSyntax *)pCVar10;
    }
    TVar13 = ParserBase::consume(&this->super_ParserBase);
    pCVar10 = parseConcatenation(this,TVar13,(ExpressionSyntax *)0x0);
    TVar13 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    name = slang::syntax::SyntaxFactory::multipleConcatenationExpression
                     (&this->factory,TVar11,pEVar3,pCVar10,TVar13);
    break;
  case 0x11:
    TVar12 = ParserBase::consume(&this->super_ParserBase);
    openParen = TVar12;
    pEVar3 = parseMinTypMaxExpression
                       (this,(bitmask<slang::parsing::detail::ExpressionOptions>)
                             (options.m_bits & 0x80));
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    if (((byte)((options.m_bits & 0x80) >> 7) & (pEVar3->super_SyntaxNode).kind == ExpressionOrDist)
        == 1) {
      location = Token::location(&openParen);
      this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc80005,location);
      range = Token::range(&closeParen);
      Diagnostic::operator<<(this_00,range);
      TVar12 = openParen;
    }
    name = (MultipleConcatenationExpressionSyntax *)
           slang::syntax::SyntaxFactory::parenthesizedExpression
                     (&this->factory,TVar12,pEVar3,closeParen);
    break;
  default:
    if (uVar1 != 0x2c) {
      if (((uVar1 == 0x7d) || (uVar1 == 0x13d)) || (uVar1 == 0x116)) {
        TVar11 = ParserBase::consume(&this->super_ParserBase);
        TVar13 = ParserBase::expect(&this->super_ParserBase,Apostrophe);
        openParen_00 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
        pEVar3 = parseExpression(this);
        closeParen_00 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        inner = slang::syntax::SyntaxFactory::parenthesizedExpression
                          (&this->factory,openParen_00,pEVar3,closeParen_00);
        pSVar4 = slang::syntax::SyntaxFactory::signedCastExpression
                           (&this->factory,TVar11,TVar13,inner);
        return &pSVar4->super_ExpressionSyntax;
      }
      if (uVar1 != 0xe5) goto switchD_001bfc50_caseD_a;
    }
  case 4:
  case 7:
    TVar12 = ParserBase::consume(&this->super_ParserBase);
    kind = slang::syntax::SyntaxFacts::getLiteralExpression(TVar12.kind);
LAB_001bfe6e:
    pLVar7 = slang::syntax::SyntaxFactory::literalExpression(&this->factory,kind,TVar12);
    return (ExpressionSyntax *)pLVar7;
  }
  return (ExpressionSyntax *)name;
}

Assistant:

ExpressionSyntax& Parser::parsePrimaryExpression(bitmask<ExpressionOptions> options) {
    TokenKind kind = peek().kind;
    switch (kind) {
        case TokenKind::StringLiteral:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::NullKeyword:
        case TokenKind::Dollar: {
            auto literal = consume();
            return factory.literalExpression(getLiteralExpression(literal.kind), literal);
        }
        case TokenKind::TimeLiteral:
            return factory.literalExpression(SyntaxKind::TimeLiteralExpression,
                                             numberParser.parseReal(*this));
        case TokenKind::RealLiteral:
            return factory.literalExpression(SyntaxKind::RealLiteralExpression,
                                             numberParser.parseReal(*this));
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
            return parseIntegerExpression(options.has(ExpressionOptions::DisallowVectors));
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto expr = &parseMinTypMaxExpression(options & ExpressionOptions::AllowDist);
            auto closeParen = expect(TokenKind::CloseParenthesis);

            if (expr->kind == SyntaxKind::ExpressionOrDist &&
                options.has(ExpressionOptions::AllowDist)) {
                addDiag(diag::NonstandardDist, openParen.location()) << closeParen.range();
            }

            return factory.parenthesizedExpression(openParen, *expr, closeParen);
        }
        case TokenKind::ApostropheOpenBrace:
            return parseAssignmentPatternExpression(nullptr);
        case TokenKind::OpenBrace: {
            // several different things this could be:
            // 1. empty queue expression { }
            // 2. streaming concatenation {>> {expr}}
            // 3. multiple concatenation {expr {concat}}
            // 4. concatenation {expr, expr}
            auto openBrace = consume();
            switch (peek().kind) {
                case TokenKind::CloseBrace:
                    return factory.emptyQueueExpression(openBrace, consume());
                case TokenKind::LeftShift:
                case TokenKind::RightShift:
                    return parseStreamConcatenation(openBrace);
                default: {
                    auto& first = parseExpression();
                    if (!peek(TokenKind::OpenBrace))
                        return parseConcatenation(openBrace, &first);
                    else {
                        auto openBraceInner = consume();
                        auto& concat = parseConcatenation(openBraceInner, nullptr);
                        auto closeBrace = expect(TokenKind::CloseBrace);
                        return factory.multipleConcatenationExpression(openBrace, first, concat,
                                                                       closeBrace);
                    }
                }
            }
        }
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
        case TokenKind::ConstKeyword: {
            auto signing = consume();
            auto apostrophe = expect(TokenKind::Apostrophe);
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& innerExpr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& parenExpr = factory.parenthesizedExpression(openParen, innerExpr, closeParen);
            return factory.signedCastExpression(signing, apostrophe, parenExpr);
        }
        case TokenKind::SystemIdentifier:
            return factory.systemName(consume());
        default:
            // possibilities here:
            // 1. data type
            // 2. qualified name
            // 3. implicit class handles
            // 4. any of [1-3] with an assignment pattern
            // 5. any of [1-3] with a cast expression
            // 6. error
            if (isPossibleDataType(kind) && kind != TokenKind::Identifier &&
                kind != TokenKind::UnitSystemName) {

                auto& type = parseDataType();
                if (peek(TokenKind::ApostropheOpenBrace))
                    return parseAssignmentPatternExpression(&type);
                else
                    return type;
            }
            else {
                bitmask<NameOptions> nameOptions = NameOptions::ExpectingExpression;
                if (options.has(ExpressionOptions::SequenceExpr))
                    nameOptions |= NameOptions::SequenceExpr;

                // parseName() will insert a missing identifier token for the error case
                auto& name = parseName(nameOptions);
                if (peek(TokenKind::ApostropheOpenBrace))
                    return parseAssignmentPatternExpression(&factory.namedType(name));
                else {
                    // otherwise just a name expression
                    return name;
                }
            }
    }
}